

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::GetMemberOfVectorOfStructByKey
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  StructDef *pSVar1;
  FieldDef *pFVar2;
  __normal_iterator<flatbuffers::FieldDef_**,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  _Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  
  pSVar1 = (field->value).type.struct_def;
  if (pSVar1->has_key == false) {
    __assert_fail("vectortype.struct_def->has_key",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_go.cpp"
                  ,0x224,
                  "void flatbuffers::go::GoGenerator::GetMemberOfVectorOfStructByKey(const StructDef &, const FieldDef &, std::string *)"
                 );
  }
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef**,std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>,__gnu_cxx::__ops::_Iter_pred<flatbuffers::go::GoGenerator::GetMemberOfVectorOfStructByKey(flatbuffers::StructDef_const&,flatbuffers::FieldDef_const&,std::__cxx11::string*)::_lambda(flatbuffers::FieldDef*)_1_>>
                    ((pSVar1->fields).vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (pSVar1->fields).vec.
                     super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  pFVar2 = *_Var3._M_current;
  if (pFVar2->key != false) {
    GenReceiver(this,struct_def,code_ptr);
    (*(this->namer_).super_Namer._vptr_Namer[0x12])(&local_88,&this->namer_,field);
    std::operator+(&local_a8," ",&local_88);
    std::operator+(&bStack_c8,&local_a8,"ByKey");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&bStack_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    TypeName_abi_cxx11_(&local_a8,this,field);
    std::operator+(&bStack_c8,"(obj *",&local_a8);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&bStack_c8);
    std::__cxx11::string::~string((string *)&local_a8);
    NativeType_abi_cxx11_(&local_48,this,&(pFVar2->value).type);
    std::operator+(&local_88,", key ",&local_48);
    std::operator+(&local_a8,&local_88,") bool ");
    OffsetPrefix_abi_cxx11_(&local_68,this,field);
    std::operator+(&bStack_c8,&local_a8,&local_68);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&bStack_c8);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::append((char *)code_ptr);
    std::__cxx11::string::append((char *)code_ptr);
    std::__cxx11::string::append((char *)code_ptr);
    std::__cxx11::string::append((char *)code_ptr);
    std::__cxx11::string::append((char *)code_ptr);
    std::__cxx11::string::append((char *)code_ptr);
    return;
  }
  __assert_fail("key_field.key",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_go.cpp"
                ,0x22e,
                "void flatbuffers::go::GoGenerator::GetMemberOfVectorOfStructByKey(const StructDef &, const FieldDef &, std::string *)"
               );
}

Assistant:

void GenEnumType(const EnumDef &enum_def, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "type " + GetEnumTypeName(enum_def) + " ";
    code += GenTypeBasic(enum_def.underlying_type) + "\n\n";
  }